

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

uint __thiscall
fmt::v5::
basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
::parse_header(basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
               *this,iterator *it,format_specs *spec)

{
  wchar_t *pwVar1;
  iterator it_00;
  uint uVar2;
  wchar_t wVar3;
  type tVar4;
  format_specs *in_RDX;
  null_terminating_iterator<wchar_t> *in_RSI;
  null_terminating_iterator<wchar_t> nVar5;
  error_handler eh_1;
  uint value;
  error_handler eh;
  char_type_conflict c;
  uint arg_index;
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
  *this_00;
  wchar_t *in_stack_ffffffffffffff78;
  iterator *in_stack_ffffffffffffff80;
  format_specs *in_stack_ffffffffffffff88;
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
  *in_stack_ffffffffffffff90;
  printf_width_handler<wchar_t> in_stack_ffffffffffffffa0;
  null_terminating_iterator<wchar_t> *in_stack_ffffffffffffffa8;
  basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
  *arg;
  printf_width_handler<wchar_t> *in_stack_ffffffffffffffb8;
  error_handler local_29;
  wchar_t local_28;
  uint local_24;
  format_specs *local_20;
  null_terminating_iterator<wchar_t> *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_24 = std::numeric_limits<unsigned_int>::max();
  local_28 = internal::null_terminating_iterator<wchar_t>::operator*(local_18);
  if ((L'/' < local_28) && (local_28 < L':')) {
    internal::error_handler::error_handler(&local_29);
    uVar2 = internal::
            parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::error_handler&>
                      (in_stack_ffffffffffffffa8,(error_handler *)in_stack_ffffffffffffffa0.spec_);
    wVar3 = internal::null_terminating_iterator<wchar_t>::operator*(local_18);
    if (wVar3 == L'$') {
      internal::null_terminating_iterator<wchar_t>::operator++(local_18);
      local_24 = uVar2;
    }
    else {
      if (local_28 == L'0') {
        (local_20->super_align_spec).fill_ = L'0';
      }
      if (uVar2 != 0) {
        (local_20->super_align_spec).width_ = uVar2;
        return local_24;
      }
    }
  }
  parse_flags(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  wVar3 = internal::null_terminating_iterator<wchar_t>::operator*(local_18);
  if ((wVar3 < L'0') ||
     (wVar3 = internal::null_terminating_iterator<wchar_t>::operator*(local_18), L'9' < wVar3)) {
    wVar3 = internal::null_terminating_iterator<wchar_t>::operator*(local_18);
    if (wVar3 == L'*') {
      nVar5 = internal::null_terminating_iterator<wchar_t>::operator++(local_18);
      arg = (basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
             *)nVar5.end_;
      internal::printf_width_handler<wchar_t>::printf_width_handler
                ((printf_width_handler<wchar_t> *)&stack0xffffffffffffffa0,local_20);
      pwVar1 = local_18->ptr_;
      this_00 = (basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
                 *)local_18->end_;
      std::numeric_limits<unsigned_int>::max();
      it_00.end_ = (wchar_t *)in_stack_ffffffffffffff80;
      it_00.ptr_ = in_stack_ffffffffffffff78;
      get_arg(this_00,it_00,(uint)((ulong)pwVar1 >> 0x20));
      tVar4 = visit_format_arg<fmt::v5::internal::printf_width_handler<wchar_t>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>>
                        (in_stack_ffffffffffffffb8,arg);
      (local_20->super_align_spec).width_ = tVar4;
    }
  }
  else {
    internal::error_handler::error_handler((error_handler *)&stack0xffffffffffffffbf);
    uVar2 = internal::
            parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::error_handler&>
                      (in_stack_ffffffffffffffa8,(error_handler *)in_stack_ffffffffffffffa0.spec_);
    (local_20->super_align_spec).width_ = uVar2;
  }
  return local_24;
}

Assistant:

unsigned basic_printf_context<OutputIt, Char, AF>::parse_header(
  iterator &it, format_specs &spec) {
  unsigned arg_index = std::numeric_limits<unsigned>::max();
  char_type c = *it;
  if (c >= '0' && c <= '9') {
    // Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag(s).
    internal::error_handler eh;
    unsigned value = parse_nonnegative_int(it, eh);
    if (*it == '$') {  // value is an argument index
      ++it;
      arg_index = value;
    } else {
      if (c == '0')
        spec.fill_ = '0';
      if (value != 0) {
        // Nonzero value means that we parsed width and don't need to
        // parse it or flags again, so return now.
        spec.width_ = value;
        return arg_index;
      }
    }
  }
  parse_flags(spec, it);
  // Parse width.
  if (*it >= '0' && *it <= '9') {
    internal::error_handler eh;
    spec.width_ = parse_nonnegative_int(it, eh);
  } else if (*it == '*') {
    ++it;
    spec.width_ = visit_format_arg(
          internal::printf_width_handler<char_type>(spec), get_arg(it));
  }
  return arg_index;
}